

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

void __thiscall CDT::set(CDT *this,DataSet *dataset,uint n_input,bool dc_sort)

{
  reference pvVar1;
  double dVar2;
  Shape SVar3;
  undefined1 local_58 [8];
  vector<Matrix<double>,_std::allocator<Matrix<double>_>_> matrices;
  uint uStack_2c;
  uint n_output;
  bool dc_sort_local;
  uint n_input_local;
  DataSet *dataset_local;
  CDT *this_local;
  
  DataSet::operator=(&this->m_dataset,dataset);
  std::vector<Layer,_std::allocator<Layer>_>::resize(&this->m_layers,3);
  SVar3 = DataSet::shape(dataset);
  matrices.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = SVar3._0_8_;
  uStack_2c = SVar3.n_col;
  dVar2 = DataSet::biased(&this->m_dataset);
  (this->m_info).bias = dVar2;
  if (dc_sort) {
    DataSet::dc_sort(&this->m_dataset);
  }
  DataSet::compile((vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *)local_58,
                   &this->m_dataset,uStack_2c - n_input);
  pvVar1 = std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::operator[]
                     ((vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *)local_58,0);
  Matrix<double>::operator=(&this->m_input,pvVar1);
  pvVar1 = std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::operator[]
                     ((vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *)local_58,1);
  Matrix<double>::operator=(&this->m_output,pvVar1);
  std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::~vector
            ((vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *)local_58);
  return;
}

Assistant:

void CDT::set(const DataSet& dataset, unsigned n_input, bool dc_sort){
    m_dataset=dataset;
    m_layers.resize(3);
    
    unsigned n_output=dataset.shape().n_col-n_input;
    m_info.bias=m_dataset.biased();
    if(dc_sort) m_dataset.dc_sort();

    std::vector<Matrix_d> matrices=m_dataset.compile(n_output);
    m_input=matrices[0];
    m_output=matrices[1];
}